

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# nl-reader.h
# Opt level: O2

void __thiscall
mp::internal::NLProblemBuilder<mp::BasicProblem<mp::BasicProblemParams<int>_>_>::OnHeader
          (NLProblemBuilder<mp::BasicProblem<mp::BasicProblemParams<int>_>_> *this,NLHeader *h)

{
  int iVar1;
  
  BasicProblem<mp::BasicProblemParams<int>_>::SetInfo(this->builder_,&h->super_NLProblemInfo);
  AddVariables(this,h);
  iVar1 = NLProblemInfo::num_common_exprs(&h->super_NLProblemInfo);
  if (iVar1 != 0) {
    BasicProblem<mp::BasicProblemParams<int>_>::AddCommonExprs(this->builder_,iVar1);
  }
  iVar1 = resulting_nobj(this,(h->super_NLProblemInfo).super_NLProblemInfo_C.num_objs);
  if (iVar1 != 0) {
    BasicProblem<mp::BasicProblemParams<int>_>::AddObjs(this->builder_,iVar1);
  }
  iVar1 = (h->super_NLProblemInfo).super_NLProblemInfo_C.num_algebraic_cons;
  if (iVar1 != 0) {
    BasicProblem<mp::BasicProblemParams<int>_>::AddAlgebraicCons(this->builder_,iVar1);
  }
  iVar1 = (h->super_NLProblemInfo).super_NLProblemInfo_C.num_logical_cons;
  if (iVar1 != 0) {
    BasicProblem<mp::BasicProblemParams<int>_>::AddLogicalCons(this->builder_,iVar1);
  }
  iVar1 = (h->super_NLProblemInfo).super_NLProblemInfo_C.num_funcs;
  if (iVar1 != 0) {
    BasicExprFactory<std::allocator<char>_>::AddFunctions(&this->builder_->super_ExprFactory,iVar1);
    return;
  }
  return;
}

Assistant:

void OnHeader(const NLHeader &h) {
    builder_.SetInfo(h);

    // As nl-benchmark shows, adding problem components at once and then
    // updating them is faster than adding them incrementally. The latter
    // requires additional checks to make sure that problem components are
    // in the correct order.
    AddVariables(h);
    if (int n = h.num_common_exprs())
      builder_.AddCommonExprs(n);
    int n_objs = resulting_nobj( h.num_objs );
    if (n_objs != 0)
      builder_.AddObjs( n_objs );
    if (h.num_algebraic_cons != 0)
      builder_.AddAlgebraicCons(h.num_algebraic_cons);
    if (h.num_logical_cons != 0)
      builder_.AddLogicalCons(h.num_logical_cons);
    if (h.num_funcs != 0)
      builder_.AddFunctions(h.num_funcs);
  }